

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_gl.c
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  EGLDisplay pvVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  EGLConfig cfg;
  undefined8 local_18;
  undefined1 local_c [4];
  
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  pvVar4 = get_egl_display_or_skip();
  cVar1 = epoxy_has_egl_extension(pvVar4,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    pcVar7 = "Test requires EGL_KHR_surfaceless_context";
  }
  else {
    iVar2 = (*_epoxy_eglBindAPI)(0x30a2);
    if (iVar2 == 0) {
      pcVar7 = "Couldn\'t initialize EGL with desktop GL\n";
    }
    else {
      iVar2 = (*_epoxy_eglChooseConfig)(pvVar4,init_egl_config_attribs,&local_18,1,local_c);
      if (iVar2 == 0) {
        pcVar7 = "Couldn\'t get an EGLConfig\n";
      }
      else {
        lVar5 = (*_epoxy_eglCreateContext)(pvVar4,local_18,0,init_egl_context_attribs);
        if (lVar5 != 0) {
          (*_epoxy_eglMakeCurrent)(pvVar4,0,0,lVar5);
          cVar1 = epoxy_is_desktop_gl();
          if (cVar1 == '\0') {
            main_cold_1();
          }
          iVar2 = epoxy_gl_version();
          if (iVar2 < 0x14) {
            main_cold_2();
          }
          uVar6 = (*_epoxy_glGetString)(0x1f02);
          printf("GL version: %s\n",uVar6);
          uVar3 = (*_epoxy_glCreateShader)(0x8b30);
          cVar1 = (*_epoxy_glIsShader)(uVar3);
          return (int)(cVar1 == '\0');
        }
        pcVar7 = "Couldn\'t create a GL context\n";
      }
    }
  }
  iVar2 = errx(0x4d,pcVar7);
  return iVar2;
}

Assistant:

int main(void)
{
    bool pass = true;
    EGLDisplay egl_dpy;
    EGLContext egl_ctx;

    /* Force epoxy to have loaded both EGL and GLX libs already -- we
     * can't assume anything about symbol resolution based on having
     * EGL or GLX loaded.
     */
    (void)glXGetCurrentContext();
    (void)eglGetCurrentContext();

    init_egl(&egl_dpy, &egl_ctx);
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;

    return pass != true;
}